

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O3

void qMakeError(QString *err,ErrorType type,QMYSQLDriverPrivate *p)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  storage_type *psVar4;
  long in_RCX;
  undefined4 in_register_00000034;
  storage_type *psVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QString local_90;
  QString local_78;
  QStringBuilder<QLatin1String,_const_QString_&> local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RCX + 0xa8) == 0) {
    lVar3 = 0;
  }
  else {
    lVar3 = mysql_error();
  }
  local_60.a.m_size = 8;
  local_60.a.m_data = "QMYSQL: ";
  local_60.b = (QString *)CONCAT44(in_register_00000034,type);
  QStringBuilder<QLatin1String,_const_QString_&>::convertTo<QString>(&local_48,&local_60);
  if (lVar3 == 0) {
    psVar5 = (storage_type *)0x0;
  }
  else {
    psVar4 = (storage_type *)0xffffffffffffffff;
    do {
      psVar5 = psVar4 + 1;
      pcVar1 = psVar4 + lVar3 + 1;
      psVar4 = psVar5;
    } while (*pcVar1 != '\0');
  }
  QVar6.m_data = psVar5;
  QVar6.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar6);
  iVar2 = mysql_errno(*(undefined8 *)(in_RCX + 0xa8));
  QString::number((uint)&local_90,iVar2);
  QSqlError::QSqlError((QSqlError *)err,&local_48,&local_78,(ErrorType)p,&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static QSqlError qMakeError(const QString &err, QSqlError::ErrorType type,
                            const QMYSQLDriverPrivate *p)
{
    const char *cerr = p->mysql ? mysql_error(p->mysql) : nullptr;
    return QSqlError("QMYSQL: "_L1 + err,
                     QString::fromUtf8(cerr),
                     type, QString::number(mysql_errno(p->mysql)));
}